

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeInternalForces
          (ChElementHexaANCF_3813_9 *this,ChVectorDynamic<> *Fi)

{
  ChMatrixNM<double,_11,_3> *d;
  Brick9_Force formula;
  ChVectorN<double,_33> result;
  
  d = &this->m_d;
  CalcCoordMatrix(this,d);
  CalcCoordDerivMatrix(this,&this->m_d_dt);
  result.super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.array[0] =
       (double)d;
  result.super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.array[1] =
       (double)d;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,11,11,1,11,11>,Eigen::Product<Eigen::Matrix<double,11,3,1,11,3>,Eigen::Transpose<Eigen::Matrix<double,11,3,1,11,3>>,0>>
            (&this->m_ddT,
             (Product<Eigen::Matrix<double,_11,_3,_1,_11,_3>,_Eigen::Transpose<Eigen::Matrix<double,_11,_3,_1,_11,_3>_>,_0>
              *)&result);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Fi);
  this->m_InteCounter = 0;
  formula.super_ChIntegrable3D<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>._vptr_ChIntegrable3D =
       (_func_int **)&PTR__ChIntegrable3D_01181d40;
  formula.m_element = this;
  Eigen::DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *)&result);
  ChQuadrature::Integrate3D<Eigen::Matrix<double,33,1,0,33,1>>
            ((Matrix<double,_33,_1,_0,_33,_1> *)&result,
             &formula.super_ChIntegrable3D<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>,-1.0,1.0,-1.0,
             1.0,-1.0,1.0,2);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
            ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)Fi,
             (MatrixBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *)&result);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    CalcCoordMatrix(m_d);
    CalcCoordDerivMatrix(m_d_dt);
    m_ddT = m_d * m_d.transpose();

    Fi.setZero();
    // Set plastic counter to zero. This runs for each integration point
    m_InteCounter = 0;
    Brick9_Force formula(this);
    ChVectorN<double, 33> result;
    result.setZero();
    ChQuadrature::Integrate3D<ChVectorN<double, 33>>(result,   // result of integration
                                                     formula,  // integrand formula
                                                     -1, 1,    // x limits
                                                     -1, 1,    // y limits
                                                     -1, 1,    // z limits
                                                     2         // order of integration
    );
    Fi -= result;
}